

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

void __thiscall helics::Federate::registerConnectorInterfacesToml(Federate *this,string *tomlString)

{
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view value;
  string_view value_00;
  string_view valueName;
  string_view valueName_00;
  string_view defVal;
  string_view defVal_00;
  string_view defVal_01;
  string_view defVal_02;
  string_view defVal_03;
  string_view defVal_04;
  string_view defVal_05;
  string_view defVal_06;
  string_view message_02;
  string_view message_03;
  string_view name;
  string_view inputType_00;
  string_view outputType_00;
  string_view name_00;
  string_view filterType;
  string_view translatorType;
  string_view endpointType;
  string_view units_00;
  format_args args;
  format_args args_00;
  string_view fmt;
  string_view fmt_00;
  bool bVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  anon_class_8_1_552cbcb6 callback;
  undefined8 uVar5;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *peVar6;
  array_type *paVar7;
  long in_RDI;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>
  *val_1;
  iterator __end3_1;
  iterator __begin3_1;
  table_type *__range3_1;
  basic_value<toml::type_config> *val;
  iterator __end3;
  iterator __begin3;
  array_type *__range3;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *globals;
  Translator *translator;
  string emessage;
  bool global_1;
  string units;
  string etype;
  TranslatorTypes opType_1;
  string ttype;
  string key_1;
  basic_value<toml::type_config> *trans;
  iterator __end2_1;
  iterator __begin2_1;
  array_type *__range2_1;
  array_type *transArray;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *transs;
  Filter *filter;
  FilterTypes opType;
  string operation;
  bool global;
  bool useTypes;
  string outputType;
  string inputType;
  bool cloningflag;
  string key;
  basic_value<toml::type_config> *filt;
  iterator __end2;
  iterator __begin2;
  array_type *__range2;
  array_type *filtArray;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *filts;
  bool defaultGlobal;
  invalid_argument *ia;
  value doc;
  key_type *in_stack_ffffffffffffedd8;
  basic_value<toml::type_config> *in_stack_ffffffffffffede0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffede8;
  Federate *in_stack_ffffffffffffedf0;
  basic_value<toml::type_config> *in_stack_ffffffffffffedf8;
  string *in_stack_ffffffffffffee00;
  undefined4 in_stack_ffffffffffffee08;
  int in_stack_ffffffffffffee0c;
  Federate *in_stack_ffffffffffffee10;
  basic_value<toml::type_config> *this_00;
  char *in_stack_ffffffffffffee18;
  char *__s;
  basic_value<toml::type_config> *in_stack_ffffffffffffee20;
  undefined8 in_stack_ffffffffffffee28;
  Federate *in_stack_ffffffffffffee30;
  size_t in_stack_ffffffffffffee38;
  char *in_stack_ffffffffffffee40;
  size_t in_stack_ffffffffffffee50;
  char *in_stack_ffffffffffffee58;
  undefined8 in_stack_ffffffffffffee60;
  TranslatorTypes in_stack_ffffffffffffee68;
  undefined4 in_stack_ffffffffffffee6c;
  Federate *in_stack_ffffffffffffee70;
  function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  *pairOp;
  string *in_stack_ffffffffffffee78;
  reference in_stack_ffffffffffffee80;
  allocator<char> *in_stack_ffffffffffffee88;
  allocator<char> *in_stack_ffffffffffffee90;
  reference in_stack_ffffffffffffee98;
  allocator<char> *in_stack_ffffffffffffeea0;
  allocator<char> *in_stack_ffffffffffffeea8;
  reference in_stack_ffffffffffffeec8;
  string *in_stack_ffffffffffffeed0;
  basic_value<toml::type_config> *in_stack_ffffffffffffeed8;
  anon_class_8_1_552cbcb6 in_stack_ffffffffffffeee0;
  undefined8 in_stack_ffffffffffffeee8;
  Federate *in_stack_ffffffffffffeef0;
  bool *in_stack_ffffffffffffef80;
  string *in_stack_ffffffffffffef88;
  value *in_stack_ffffffffffffef90;
  string *key_00;
  undefined7 in_stack_ffffffffffffefb0;
  undefined4 in_stack_fffffffffffff000;
  FilterTypes FVar8;
  undefined7 in_stack_fffffffffffff040;
  byte in_stack_fffffffffffff047;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_stack_fffffffffffff048;
  allocator<char> *in_stack_fffffffffffff050;
  undefined7 in_stack_fffffffffffff058;
  undefined1 in_stack_fffffffffffff05f;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_stack_fffffffffffff060;
  basic_value<toml::type_config> *in_stack_fffffffffffff068;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_stack_fffffffffffff070;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_stack_fffffffffffff088;
  value *in_stack_fffffffffffff090;
  string *in_stack_fffffffffffff098;
  allocator<char> local_eb9 [120];
  undefined1 in_stack_fffffffffffff1bf;
  value *in_stack_fffffffffffff1c0;
  Filter *in_stack_fffffffffffff1c8;
  Federate *in_stack_fffffffffffff1d0;
  undefined1 local_dc8 [272];
  __sv_type local_cb8;
  __sv_type local_ca8;
  reference local_c98;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
  local_c90;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
  local_c88;
  table_type *local_c80;
  __sv_type local_c78;
  __sv_type local_c68;
  reference local_c58;
  basic_value<toml::type_config> *local_c50;
  __normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
  local_c48;
  array_type *local_c40;
  allocator<char> local_c31 [33];
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *local_c10;
  function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  local_c01;
  Translator *local_be0;
  string local_bd1;
  allocator<char> local_ba9 [33];
  Translator *local_b88;
  allocator<char> local_b79 [40];
  allocator<char> local_b51 [33];
  Translator *local_b30;
  allocator<char> local_b21 [40];
  allocator<char> local_af9 [33];
  Translator *local_ad8;
  allocator<char> local_ac9 [40];
  string local_aa1;
  Translator *local_a80;
  undefined1 local_a71 [73];
  Translator *local_a28;
  allocator<char> local_a19 [40];
  allocator<char> local_9f1 [33];
  __sv_type local_9d0;
  __sv_type local_9c0;
  __sv_type local_9b0;
  Translator *local_9a0;
  char *local_998;
  undefined8 local_990;
  undefined1 local_988 [32];
  __sv_type local_968;
  __sv_type local_958;
  __sv_type local_948;
  char *local_938;
  undefined8 local_930;
  undefined1 local_928 [39];
  allocator<char> local_901 [39];
  undefined1 local_8da;
  allocator<char> local_8d9 [33];
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  allocator<char> local_899 [65];
  undefined8 local_858;
  undefined8 uStack_850;
  allocator<char> local_839 [65];
  __sv_type local_7f8;
  TranslatorTypes local_7e8;
  allocator<char> local_7e1 [33];
  __sv_type local_7c0;
  allocator<char> local_7a9 [33];
  undefined1 local_788 [32];
  undefined8 local_768;
  undefined8 uStack_760;
  string local_749 [2];
  reference local_708;
  basic_value<toml::type_config> *local_700;
  __normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
  local_6f8;
  value *local_6f0;
  value *local_6e8;
  string local_6c9;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *local_6a8;
  allocator<char> local_699 [33];
  Filter *local_678;
  allocator<char> local_669 [33];
  Filter *local_648;
  allocator<char> local_639 [40];
  allocator<char> local_611 [33];
  Filter *local_5f0;
  allocator<char> local_5e1 [40];
  allocator<char> local_5b9 [33];
  __sv_type local_598;
  __sv_type local_588;
  __sv_type local_578;
  Filter *local_568;
  undefined4 local_55c;
  __sv_type local_558;
  FilterTypes local_548;
  allocator<char> local_541 [33];
  __sv_type local_520;
  allocator<char> local_509 [72];
  allocator<char> local_4c1 [39];
  byte local_49a;
  byte local_499;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined1 local_479 [168];
  undefined1 local_3d1 [129];
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_350;
  basic_value<toml::type_config> *local_348;
  __normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
  local_340;
  array_type *local_338;
  array_type *local_330;
  allocator<char> local_311 [33];
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *local_2f0;
  allocator<char> local_2e1 [40];
  allocator<char> local_2b9 [40];
  undefined1 local_291;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined1 *local_b0;
  char *local_a8;
  undefined8 uStack_a0;
  undefined1 *local_98;
  char *local_90;
  undefined8 uStack_88;
  undefined1 *local_80;
  undefined1 local_78 [16];
  undefined8 local_68;
  undefined1 *local_60;
  char *local_58;
  undefined8 uStack_50;
  undefined1 *local_40;
  char *local_38;
  undefined8 uStack_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined8 *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  toml::basic_value<toml::type_config>::basic_value(in_stack_ffffffffffffede0);
  fileops::loadToml(in_stack_fffffffffffff098);
  toml::basic_value<toml::type_config>::operator=
            (in_stack_ffffffffffffedf8,(basic_value<toml::type_config> *)in_stack_ffffffffffffedf0);
  toml::basic_value<toml::type_config>::~basic_value(in_stack_ffffffffffffede0);
  local_291 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee20,in_stack_ffffffffffffee18,
             (allocator<char> *)in_stack_ffffffffffffee10);
  fileops::replaceIfMember<bool>
            (in_stack_ffffffffffffef90,in_stack_ffffffffffffef88,in_stack_ffffffffffffef80);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffede0);
  std::allocator<char>::~allocator(local_2b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee20,in_stack_ffffffffffffee18,
             (allocator<char> *)in_stack_ffffffffffffee10);
  bVar1 = fileops::isMember(in_stack_ffffffffffffef90,in_stack_ffffffffffffef88);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffede0);
  std::allocator<char>::~allocator(local_2e1);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffee20,in_stack_ffffffffffffee18,
               (allocator<char> *)in_stack_ffffffffffffee10);
    peVar6 = toml::find<toml::type_config>(in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffede0);
    std::allocator<char>::~allocator(local_311);
    local_2f0 = peVar6;
    bVar1 = toml::basic_value<toml::type_config>::is_array
                      ((basic_value<toml::type_config> *)0x34447c);
    if (!bVar1) {
      uVar5 = __cxa_allocate_exception(0x28);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedf0,
                 (char *)in_stack_ffffffffffffede8);
      message._M_str = (char *)in_stack_ffffffffffffee00;
      message._M_len = (size_t)in_stack_ffffffffffffedf8;
      InvalidParameter::InvalidParameter((InvalidParameter *)in_stack_ffffffffffffedf0,message);
      __cxa_throw(uVar5,&InvalidParameter::typeinfo,InvalidParameter::~InvalidParameter);
    }
    local_338 = toml::basic_value<toml::type_config>::as_array(in_stack_ffffffffffffee20);
    local_330 = local_338;
    local_340._M_current =
         (basic_value<toml::type_config> *)
         std::
         vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
         ::begin((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                  *)in_stack_ffffffffffffedd8);
    local_348 = (basic_value<toml::type_config> *)
                std::
                vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                ::end((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                       *)in_stack_ffffffffffffedd8);
    while (bVar1 = __gnu_cxx::
                   operator==<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                             ((__normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                               *)in_stack_ffffffffffffede0,
                              (__normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                               *)in_stack_ffffffffffffedd8), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_350.values_ =
           (value<fmt::v11::context> *)
           __gnu_cxx::
           __normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
           ::operator*(&local_340);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffee20,in_stack_ffffffffffffee18,
                 (allocator<char> *)in_stack_ffffffffffffee10);
      local_3d1._41_8_ = 0;
      local_3d1._49_8_ = 0;
      defVal._M_str = in_stack_ffffffffffffee18;
      defVal._M_len = (size_t)in_stack_ffffffffffffee10;
      fileops::getOrDefault
                ((value *)CONCAT44(in_stack_ffffffffffffee0c,in_stack_ffffffffffffee08),
                 in_stack_ffffffffffffee00,defVal);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffede0);
      std::allocator<char>::~allocator((allocator<char> *)(local_3d1 + 0x40));
      in_stack_fffffffffffff090 = (value *)local_3d1;
      in_stack_fffffffffffff088 = local_350;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffee20,in_stack_ffffffffffffee18,
                 (allocator<char> *)in_stack_ffffffffffffee10);
      bVar1 = fileops::getOrDefault(in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8,false);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffede0);
      std::allocator<char>::~allocator((allocator<char> *)local_3d1);
      in_stack_fffffffffffff070 = local_350;
      local_3d1[0x28] = bVar1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffee20,in_stack_ffffffffffffee18,
                 (allocator<char> *)in_stack_ffffffffffffee10);
      local_479._65_8_ = 0;
      local_479._73_8_ = 0;
      defVal_00._M_str = in_stack_ffffffffffffee18;
      defVal_00._M_len = (size_t)in_stack_ffffffffffffee10;
      fileops::getOrDefault
                ((value *)CONCAT44(in_stack_ffffffffffffee0c,in_stack_ffffffffffffee08),
                 in_stack_ffffffffffffee00,defVal_00);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffede0);
      std::allocator<char>::~allocator((allocator<char> *)(local_479 + 0x60));
      in_stack_fffffffffffff068 = (basic_value<toml::type_config> *)local_479;
      in_stack_fffffffffffff060 = local_350;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffee20,in_stack_ffffffffffffee18,
                 (allocator<char> *)in_stack_ffffffffffffee10);
      local_498 = 0;
      uStack_490 = 0;
      defVal_01._M_str = in_stack_ffffffffffffee18;
      defVal_01._M_len = (size_t)in_stack_ffffffffffffee10;
      fileops::getOrDefault
                ((value *)CONCAT44(in_stack_ffffffffffffee0c,in_stack_ffffffffffffee08),
                 in_stack_ffffffffffffee00,defVal_01);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffede0);
      std::allocator<char>::~allocator((allocator<char> *)local_479);
      bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3448d0);
      in_stack_fffffffffffff05f = false;
      if (bVar1) {
        in_stack_fffffffffffff05f =
             CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3448ef);
      }
      local_499 = ~in_stack_fffffffffffff05f & 1;
      in_stack_fffffffffffff050 = local_4c1;
      in_stack_fffffffffffff048 = local_350;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffee20,in_stack_ffffffffffffee18,
                 (allocator<char> *)in_stack_ffffffffffffee10);
      in_stack_fffffffffffff047 =
           fileops::getOrDefault(in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8,false);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffede0);
      std::allocator<char>::~allocator(local_4c1);
      local_49a = in_stack_fffffffffffff047 & 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffee20,in_stack_ffffffffffffee18,
                 (allocator<char> *)in_stack_ffffffffffffee10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffee20,in_stack_ffffffffffffee18,
                 (allocator<char> *)in_stack_ffffffffffffee10);
      local_520 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffede0);
      defVal_02._M_str = in_stack_ffffffffffffee18;
      defVal_02._M_len = (size_t)in_stack_ffffffffffffee10;
      fileops::getOrDefault
                ((value *)CONCAT44(in_stack_ffffffffffffee0c,in_stack_ffffffffffffee08),
                 in_stack_ffffffffffffee00,defVal_02);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffede0);
      std::allocator<char>::~allocator(local_541);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffede0);
      std::allocator<char>::~allocator(local_509);
      local_558 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffede0);
      filterType._M_str = (char *)in_stack_ffffffffffffee88;
      filterType._M_len = (size_t)in_stack_ffffffffffffee80;
      local_548 = filterTypeFromString(filterType);
      bVar1 = checkValidFilterType
                        (in_stack_ffffffffffffeef0,SUB81((ulong)in_stack_ffffffffffffeee8 >> 0x38,0)
                         ,(FilterTypes)in_stack_ffffffffffffeee8,
                         (string *)in_stack_ffffffffffffeee0.filter);
      if (bVar1) {
        uVar3 = (uint)(byte)local_3d1[0x28];
        uVar4 = (uint)local_49a;
        local_578 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_ffffffffffffede0);
        FVar8 = local_548;
        local_588 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_ffffffffffffede0);
        local_598 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_ffffffffffffede0);
        name._M_str = in_stack_ffffffffffffee40;
        name._M_len = in_stack_ffffffffffffee38;
        inputType_00._M_str = in_stack_ffffffffffffee58;
        inputType_00._M_len = in_stack_ffffffffffffee50;
        outputType_00._M_str._0_4_ = in_stack_ffffffffffffee68;
        outputType_00._M_len = in_stack_ffffffffffffee60;
        outputType_00._M_str._4_4_ = in_stack_ffffffffffffee6c;
        in_stack_ffffffffffffedd8 = (key_type *)local_588._M_len;
        in_stack_ffffffffffffede0 = (basic_value<toml::type_config> *)local_588._M_str;
        in_stack_ffffffffffffede8 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_598._M_len;
        in_stack_ffffffffffffedf0 = (Federate *)local_598._M_str;
        callback.filter =
             generateFilter(in_stack_ffffffffffffee30,
                            SUB81((ulong)in_stack_ffffffffffffee28 >> 0x38,0),
                            SUB81((ulong)in_stack_ffffffffffffee28 >> 0x30,0),name,
                            (FilterTypes)in_stack_ffffffffffffee28,inputType_00,outputType_00);
        local_568 = callback.filter;
        loadOptions<toml::basic_value<toml::type_config>,helics::Filter>
                  ((Federate *)in_stack_fffffffffffff070.values_,in_stack_fffffffffffff068,
                   (Filter *)in_stack_fffffffffffff060.values_);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffee20,in_stack_ffffffffffffee18,
                   (allocator<char> *)in_stack_ffffffffffffee10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffee20,in_stack_ffffffffffffee18,
                   (allocator<char> *)in_stack_ffffffffffffee10);
        local_5f0 = local_568;
        addTargetVariations<toml::basic_value<toml::type_config>,helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__3>
                  (in_stack_ffffffffffffeed8,in_stack_ffffffffffffeed0,
                   (string *)in_stack_ffffffffffffeec8,in_stack_ffffffffffffeee0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffede0);
        std::allocator<char>::~allocator(local_5e1);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffede0);
        std::allocator<char>::~allocator(local_5b9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffee20,in_stack_ffffffffffffee18,
                   (allocator<char> *)in_stack_ffffffffffffee10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffee20,in_stack_ffffffffffffee18,
                   (allocator<char> *)in_stack_ffffffffffffee10);
        local_648 = local_568;
        addTargetVariations<toml::basic_value<toml::type_config>,helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__4>
                  (in_stack_ffffffffffffeed8,in_stack_ffffffffffffeed0,
                   (string *)in_stack_ffffffffffffeec8,in_stack_ffffffffffffeee0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffede0);
        std::allocator<char>::~allocator(local_639);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffede0);
        std::allocator<char>::~allocator(local_611);
        if ((local_3d1[0x28] & literal) != basic) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffee20,in_stack_ffffffffffffee18,
                     (allocator<char> *)in_stack_ffffffffffffee10);
          local_678 = local_568;
          addTargets<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__5>
                    ((value *)CONCAT44(uVar3,FVar8),
                     (string *)CONCAT44(uVar4,in_stack_fffffffffffff000),callback);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffede0);
          std::allocator<char>::~allocator(local_669);
        }
        loadPropertiesToml<helics::Filter>
                  (in_stack_fffffffffffff1d0,in_stack_fffffffffffff1c8,in_stack_fffffffffffff1c0,
                   (bool)in_stack_fffffffffffff1bf);
        local_55c = 0;
      }
      else {
        local_55c = 3;
      }
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffede0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffede0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffede0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffede0);
      __gnu_cxx::
      __normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
      ::operator++(&local_340);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee20,in_stack_ffffffffffffee18,
             (allocator<char> *)in_stack_ffffffffffffee10);
  bVar2 = fileops::isMember(in_stack_ffffffffffffef90,in_stack_ffffffffffffef88);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffede0);
  std::allocator<char>::~allocator(local_699);
  if ((bVar2 & 1) != 0) {
    key_00 = &local_6c9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffee20,in_stack_ffffffffffffee18,
               (allocator<char> *)in_stack_ffffffffffffee10);
    peVar6 = toml::find<toml::type_config>(in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffede0);
    std::allocator<char>::~allocator((allocator<char> *)&local_6c9);
    local_6a8 = peVar6;
    bVar1 = toml::basic_value<toml::type_config>::is_array
                      ((basic_value<toml::type_config> *)0x34539d);
    if (!bVar1) {
      uVar5 = __cxa_allocate_exception(0x28);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffedf0,
                 (char *)in_stack_ffffffffffffede8);
      message_00._M_str = (char *)in_stack_ffffffffffffee00;
      message_00._M_len = (size_t)in_stack_ffffffffffffedf8;
      InvalidParameter::InvalidParameter((InvalidParameter *)in_stack_ffffffffffffedf0,message_00);
      __cxa_throw(uVar5,&InvalidParameter::typeinfo,InvalidParameter::~InvalidParameter);
    }
    in_stack_ffffffffffffef90 =
         (value *)toml::basic_value<toml::type_config>::as_array(in_stack_ffffffffffffee20);
    local_6f0 = in_stack_ffffffffffffef90;
    local_6e8 = in_stack_ffffffffffffef90;
    local_6f8._M_current =
         (basic_value<toml::type_config> *)
         std::
         vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
         ::begin((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                  *)in_stack_ffffffffffffedd8);
    local_700 = (basic_value<toml::type_config> *)
                std::
                vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                ::end((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                       *)in_stack_ffffffffffffedd8);
    while (bVar1 = __gnu_cxx::
                   operator==<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                             ((__normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                               *)in_stack_ffffffffffffede0,
                              (__normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                               *)in_stack_ffffffffffffedd8), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_708 = __gnu_cxx::
                  __normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                  ::operator*(&local_6f8);
      in_stack_ffffffffffffef88 = local_749;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffee20,in_stack_ffffffffffffee18,
                 (allocator<char> *)in_stack_ffffffffffffee10);
      local_768 = 0;
      uStack_760 = 0;
      defVal_03._M_str = in_stack_ffffffffffffee18;
      defVal_03._M_len = (size_t)in_stack_ffffffffffffee10;
      fileops::getOrDefault
                ((value *)CONCAT44(in_stack_ffffffffffffee0c,in_stack_ffffffffffffee08),
                 in_stack_ffffffffffffee00,defVal_03);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffede0);
      std::allocator<char>::~allocator((allocator<char> *)local_749);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffee20,in_stack_ffffffffffffee18,
                 (allocator<char> *)in_stack_ffffffffffffee10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffee20,in_stack_ffffffffffffee18,
                 (allocator<char> *)in_stack_ffffffffffffee10);
      local_7c0 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffede0);
      defVal_04._M_str = in_stack_ffffffffffffee18;
      defVal_04._M_len = (size_t)in_stack_ffffffffffffee10;
      fileops::getOrDefault
                ((value *)CONCAT44(in_stack_ffffffffffffee0c,in_stack_ffffffffffffee08),
                 in_stack_ffffffffffffee00,defVal_04);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffede0);
      std::allocator<char>::~allocator(local_7e1);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffede0);
      std::allocator<char>::~allocator(local_7a9);
      local_7f8 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffede0);
      translatorType._M_str = (char *)in_stack_ffffffffffffee88;
      translatorType._M_len = (size_t)in_stack_ffffffffffffee80;
      local_7e8 = translatorTypeFromString(translatorType);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffee20,in_stack_ffffffffffffee18,
                 (allocator<char> *)in_stack_ffffffffffffee10);
      local_858 = 0;
      uStack_850 = 0;
      defVal_05._M_str = in_stack_ffffffffffffee18;
      defVal_05._M_len = (size_t)in_stack_ffffffffffffee10;
      fileops::getOrDefault
                ((value *)CONCAT44(in_stack_ffffffffffffee0c,in_stack_ffffffffffffee08),
                 in_stack_ffffffffffffee00,defVal_05);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffede0);
      std::allocator<char>::~allocator(local_839);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffee20,in_stack_ffffffffffffee18,
                 (allocator<char> *)in_stack_ffffffffffffee10);
      local_8b8 = 0;
      uStack_8b0 = 0;
      defVal_06._M_str = in_stack_ffffffffffffee18;
      defVal_06._M_len = (size_t)in_stack_ffffffffffffee10;
      fileops::getOrDefault
                ((value *)CONCAT44(in_stack_ffffffffffffee0c,in_stack_ffffffffffffee08),
                 in_stack_ffffffffffffee00,defVal_06);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffede0);
      std::allocator<char>::~allocator(local_899);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffee20,in_stack_ffffffffffffee18,
                 (allocator<char> *)in_stack_ffffffffffffee10);
      fileops::replaceIfMember
                ((value *)CONCAT17(bVar2,in_stack_ffffffffffffefb0),key_00,(string *)peVar6);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffede0);
      std::allocator<char>::~allocator(local_8d9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffee20,in_stack_ffffffffffffee18,
                 (allocator<char> *)in_stack_ffffffffffffee10);
      bVar1 = fileops::getOrDefault(in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8,false);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffede0);
      std::allocator<char>::~allocator(local_901);
      local_8da = bVar1;
      if (local_7e8 == UNRECOGNIZED) {
        if ((*(byte *)(in_RDI + 10) & 1) != 0) {
          local_938 = "unrecognized translator type:{}";
          local_930 = 0x1f;
          local_28 = local_928;
          local_38 = "unrecognized translator type:{}";
          uStack_30 = 0x1f;
          local_40 = local_788;
          local_58 = "unrecognized translator type:{}";
          uStack_50 = 0x1f;
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)in_stack_ffffffffffffedf0,in_stack_ffffffffffffede8
                    );
          local_18 = &local_68;
          local_20 = local_78;
          local_68 = 0xd;
          fmt.size_._0_7_ = in_stack_fffffffffffff058;
          fmt.data_ = (char *)in_stack_fffffffffffff050;
          fmt.size_._7_1_ = in_stack_fffffffffffff05f;
          args.desc_._7_1_ = in_stack_fffffffffffff047;
          args.desc_._0_7_ = in_stack_fffffffffffff040;
          args.field_1.values_ = in_stack_fffffffffffff048.values_;
          local_60 = local_20;
          ::fmt::v11::vformat_abi_cxx11_(fmt,args);
          local_948 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_ffffffffffffede0);
          message_02._M_str = (char *)in_stack_ffffffffffffee20;
          message_02._M_len = (size_t)in_stack_ffffffffffffee18;
          logMessage(in_stack_ffffffffffffee10,in_stack_ffffffffffffee0c,message_02);
          uVar5 = __cxa_allocate_exception(0x28);
          local_958 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_ffffffffffffede0);
          message_01._M_str = (char *)in_stack_ffffffffffffee00;
          message_01._M_len = (size_t)in_stack_ffffffffffffedf8;
          InvalidParameter::InvalidParameter
                    ((InvalidParameter *)in_stack_ffffffffffffedf0,message_01);
          __cxa_throw(uVar5,&InvalidParameter::typeinfo,InvalidParameter::~InvalidParameter);
        }
        local_998 = "unrecognized filter operation:{}";
        local_990 = 0x20;
        local_80 = local_988;
        local_90 = "unrecognized filter operation:{}";
        uStack_88 = 0x20;
        local_98 = local_788;
        local_a8 = "unrecognized filter operation:{}";
        uStack_a0 = 0x20;
        ::fmt::v11::detail::value<fmt::v11::context>::
        value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                  ((value<fmt::v11::context> *)in_stack_ffffffffffffedf0,in_stack_ffffffffffffede8);
        local_8 = &local_b8;
        local_10 = local_c8;
        local_b8 = 0xd;
        fmt_00.size_._0_7_ = in_stack_fffffffffffff058;
        fmt_00.data_ = (char *)in_stack_fffffffffffff050;
        fmt_00.size_._7_1_ = in_stack_fffffffffffff05f;
        args_00.desc_._7_1_ = in_stack_fffffffffffff047;
        args_00.desc_._0_7_ = in_stack_fffffffffffff040;
        args_00.field_1.values_ = in_stack_fffffffffffff048.values_;
        local_b0 = local_10;
        ::fmt::v11::vformat_abi_cxx11_(fmt_00,args_00);
        local_968 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_ffffffffffffede0);
        message_03._M_str = (char *)in_stack_ffffffffffffee20;
        message_03._M_len = (size_t)in_stack_ffffffffffffee18;
        logMessage(in_stack_ffffffffffffee10,in_stack_ffffffffffffee0c,message_03);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffede0);
        local_55c = 5;
      }
      else {
        local_9b0 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_ffffffffffffede0);
        local_9c0 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_ffffffffffffede0);
        local_9d0 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_ffffffffffffede0);
        name_00._M_str = (char *)in_stack_ffffffffffffee80;
        name_00._M_len = (size_t)in_stack_ffffffffffffee78;
        endpointType._M_str = (char *)in_stack_ffffffffffffee98;
        endpointType._M_len = (size_t)in_stack_ffffffffffffee90;
        units_00._M_str = (char *)in_stack_ffffffffffffeea8;
        units_00._M_len = (size_t)in_stack_ffffffffffffeea0;
        in_stack_ffffffffffffedd8 = (key_type *)local_9c0._M_len;
        in_stack_ffffffffffffede0 = (basic_value<toml::type_config> *)local_9c0._M_str;
        in_stack_ffffffffffffede8 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9d0._M_len;
        in_stack_ffffffffffffedf0 = (Federate *)local_9d0._M_str;
        local_9a0 = generateTranslator(in_stack_ffffffffffffee70,
                                       SUB41((uint)in_stack_ffffffffffffee6c >> 0x18,0),name_00,
                                       in_stack_ffffffffffffee68,endpointType,units_00);
        loadOptions<toml::basic_value<toml::type_config>,helics::Translator>
                  ((Federate *)in_stack_fffffffffffff070.values_,in_stack_fffffffffffff068,
                   (Translator *)in_stack_fffffffffffff060.values_);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffee20,in_stack_ffffffffffffee18,
                   (allocator<char> *)in_stack_ffffffffffffee10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffee20,in_stack_ffffffffffffee18,
                   (allocator<char> *)in_stack_ffffffffffffee10);
        local_a28 = local_9a0;
        addTargetVariations<toml::basic_value<toml::type_config>,helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__6>
                  (in_stack_ffffffffffffeed8,in_stack_ffffffffffffeed0,
                   (string *)in_stack_ffffffffffffeec8,
                   (anon_class_8_1_36d583d8)in_stack_ffffffffffffeee0.filter);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffede0);
        std::allocator<char>::~allocator(local_a19);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffede0);
        std::allocator<char>::~allocator(local_9f1);
        in_stack_ffffffffffffeee0.filter = (Filter *)local_708;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffee20,in_stack_ffffffffffffee18,
                   (allocator<char> *)in_stack_ffffffffffffee10);
        in_stack_ffffffffffffeed8 = (basic_value<toml::type_config> *)local_a71;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffee20,in_stack_ffffffffffffee18,
                   (allocator<char> *)in_stack_ffffffffffffee10);
        local_a80 = local_9a0;
        addTargetVariations<toml::basic_value<toml::type_config>,helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__7>
                  (in_stack_ffffffffffffeed8,in_stack_ffffffffffffeed0,
                   (string *)in_stack_ffffffffffffeec8,
                   (anon_class_8_1_36d583d8)in_stack_ffffffffffffeee0.filter);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffede0);
        std::allocator<char>::~allocator((allocator<char> *)local_a71);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffede0);
        std::allocator<char>::~allocator((allocator<char> *)(local_a71 + 0x28));
        in_stack_ffffffffffffeed0 = &local_aa1;
        in_stack_ffffffffffffeec8 = local_708;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffee20,in_stack_ffffffffffffee18,
                   (allocator<char> *)in_stack_ffffffffffffee10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffee20,in_stack_ffffffffffffee18,
                   (allocator<char> *)in_stack_ffffffffffffee10);
        local_ad8 = local_9a0;
        addTargetVariations<toml::basic_value<toml::type_config>,helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__8>
                  (in_stack_ffffffffffffeed8,in_stack_ffffffffffffeed0,
                   (string *)in_stack_ffffffffffffeec8,
                   (anon_class_8_1_36d583d8)in_stack_ffffffffffffeee0.filter);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffede0);
        std::allocator<char>::~allocator(local_ac9);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffede0);
        std::allocator<char>::~allocator((allocator<char> *)&local_aa1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffee20,in_stack_ffffffffffffee18,
                   (allocator<char> *)in_stack_ffffffffffffee10);
        in_stack_ffffffffffffeea8 = local_b21;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffee20,in_stack_ffffffffffffee18,
                   (allocator<char> *)in_stack_ffffffffffffee10);
        local_b30 = local_9a0;
        addTargetVariations<toml::basic_value<toml::type_config>,helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__9>
                  (in_stack_ffffffffffffeed8,in_stack_ffffffffffffeed0,
                   (string *)in_stack_ffffffffffffeec8,
                   (anon_class_8_1_36d583d8)in_stack_ffffffffffffeee0.filter);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffede0);
        std::allocator<char>::~allocator(local_b21);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffede0);
        std::allocator<char>::~allocator(local_af9);
        in_stack_ffffffffffffeea0 = local_b51;
        in_stack_ffffffffffffee98 = local_708;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffee20,in_stack_ffffffffffffee18,
                   (allocator<char> *)in_stack_ffffffffffffee10);
        in_stack_ffffffffffffee90 = local_b79;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffee20,in_stack_ffffffffffffee18,
                   (allocator<char> *)in_stack_ffffffffffffee10);
        local_b88 = local_9a0;
        addTargetVariations<toml::basic_value<toml::type_config>,helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__10>
                  (in_stack_ffffffffffffeed8,in_stack_ffffffffffffeed0,
                   (string *)in_stack_ffffffffffffeec8,
                   (anon_class_8_1_36d583d8)in_stack_ffffffffffffeee0.filter);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffede0);
        std::allocator<char>::~allocator(local_b79);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffede0);
        std::allocator<char>::~allocator(local_b51);
        in_stack_ffffffffffffee88 = local_ba9;
        in_stack_ffffffffffffee80 = local_708;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffee20,in_stack_ffffffffffffee18,
                   (allocator<char> *)in_stack_ffffffffffffee10);
        in_stack_ffffffffffffee78 = &local_bd1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffee20,in_stack_ffffffffffffee18,
                   (allocator<char> *)in_stack_ffffffffffffee10);
        local_be0 = local_9a0;
        addTargetVariations<toml::basic_value<toml::type_config>,helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__11>
                  (in_stack_ffffffffffffeed8,in_stack_ffffffffffffeed0,
                   (string *)in_stack_ffffffffffffeec8,
                   (anon_class_8_1_36d583d8)in_stack_ffffffffffffeee0.filter);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffede0);
        std::allocator<char>::~allocator((allocator<char> *)&local_bd1);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffede0);
        std::allocator<char>::~allocator(local_ba9);
        loadPropertiesToml<helics::Translator>
                  (in_stack_fffffffffffff1d0,(Translator *)in_stack_fffffffffffff1c8,
                   in_stack_fffffffffffff1c0,(bool)in_stack_fffffffffffff1bf);
        local_55c = 0;
      }
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffede0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffede0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffede0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffede0);
      __gnu_cxx::
      __normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
      ::operator++(&local_6f8);
    }
  }
  pairOp = &local_c01;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee20,in_stack_ffffffffffffee18,
             (allocator<char> *)in_stack_ffffffffffffee10);
  bVar2 = fileops::isMember(in_stack_ffffffffffffef90,in_stack_ffffffffffffef88);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffede0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c01);
  if ((bVar2 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffee20,in_stack_ffffffffffffee18,
               (allocator<char> *)in_stack_ffffffffffffee10);
    peVar6 = toml::find<toml::type_config>(in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffede0);
    std::allocator<char>::~allocator(local_c31);
    local_c10 = peVar6;
    bVar1 = toml::basic_value<toml::type_config>::is_array
                      ((basic_value<toml::type_config> *)0x346956);
    if (bVar1) {
      local_c40 = toml::basic_value<toml::type_config>::as_array(in_stack_ffffffffffffee20);
      local_c48._M_current =
           (basic_value<toml::type_config> *)
           std::
           vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
           ::begin((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                    *)in_stack_ffffffffffffedd8);
      local_c50 = (basic_value<toml::type_config> *)
                  std::
                  vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                  ::end((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                         *)in_stack_ffffffffffffedd8);
      while (bVar1 = __gnu_cxx::
                     operator==<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                               ((__normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                                 *)in_stack_ffffffffffffede0,
                                (__normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                                 *)in_stack_ffffffffffffedd8), ((bVar1 ^ 0xffU) & 1) != 0) {
        local_c58 = __gnu_cxx::
                    __normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                    ::operator*(&local_c48);
        paVar7 = toml::basic_value<toml::type_config>::as_array(in_stack_ffffffffffffee20);
        std::
        vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
        ::operator[](paVar7,0);
        toml::basic_value<toml::type_config>::as_string_abi_cxx11_(in_stack_ffffffffffffee20);
        local_c68 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_ffffffffffffede0);
        paVar7 = toml::basic_value<toml::type_config>::as_array(in_stack_ffffffffffffee20);
        std::
        vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
        ::operator[](paVar7,1);
        toml::basic_value<toml::type_config>::as_string_abi_cxx11_(in_stack_ffffffffffffee20);
        local_c78 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_ffffffffffffede0);
        valueName._M_len._4_4_ = in_stack_ffffffffffffee0c;
        valueName._M_len._0_4_ = in_stack_ffffffffffffee08;
        valueName._M_str = (char *)in_stack_ffffffffffffee10;
        value._M_str = (char *)in_stack_ffffffffffffee00;
        value._M_len = (size_t)in_stack_ffffffffffffedf8;
        setGlobal(in_stack_ffffffffffffedf0,valueName,value);
        __gnu_cxx::
        __normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
        ::operator++(&local_c48);
      }
    }
    else {
      local_c80 = toml::basic_value<toml::type_config>::as_table_abi_cxx11_
                            (in_stack_ffffffffffffee20);
      local_c88._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
           ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
                    *)in_stack_ffffffffffffedd8);
      local_c90._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
           ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
                  *)in_stack_ffffffffffffedd8);
      while (bVar1 = std::__detail::operator==(&local_c88,&local_c90), ((bVar1 ^ 0xffU) & 1) != 0) {
        local_c98 = std::__detail::
                    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
                    ::operator*((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
                                 *)0x346bc8);
        local_ca8 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_ffffffffffffede0);
        in_stack_ffffffffffffee20 =
             (basic_value<toml::type_config> *)
             toml::basic_value<toml::type_config>::as_string_abi_cxx11_(in_stack_ffffffffffffee20);
        local_cb8 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_ffffffffffffede0);
        valueName_00._M_len._4_4_ = in_stack_ffffffffffffee0c;
        valueName_00._M_len._0_4_ = in_stack_ffffffffffffee08;
        valueName_00._M_str = (char *)in_stack_ffffffffffffee10;
        value_00._M_str = (char *)in_stack_ffffffffffffee00;
        value_00._M_len = (size_t)in_stack_ffffffffffffedf8;
        setGlobal(in_stack_ffffffffffffedf0,valueName_00,value_00);
        std::__detail::
        _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
        ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
                      *)in_stack_ffffffffffffede0);
      }
    }
  }
  toml::basic_value<toml::type_config>::basic_value
            ((basic_value<toml::type_config> *)in_stack_ffffffffffffee10,
             (basic_value<toml::type_config> *)
             CONCAT44(in_stack_ffffffffffffee0c,in_stack_ffffffffffffee08));
  __s = local_dc8 + 0x27;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee20,__s,(allocator<char> *)in_stack_ffffffffffffee10);
  this_00 = (basic_value<toml::type_config> *)local_dc8;
  std::
  function<void(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)>
  ::
  function<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__0,void>
            ((function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
              *)in_stack_ffffffffffffedf0,(anon_class_8_1_8991fb9c *)in_stack_ffffffffffffede8);
  arrayPairProcess(in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,pairOp);
  std::
  function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::~function((function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
               *)0x346cfd);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffede0);
  std::allocator<char>::~allocator((allocator<char> *)(local_dc8 + 0x27));
  toml::basic_value<toml::type_config>::~basic_value(in_stack_ffffffffffffede0);
  toml::basic_value<toml::type_config>::basic_value
            (this_00,(basic_value<toml::type_config> *)
                     CONCAT44(in_stack_ffffffffffffee0c,in_stack_ffffffffffffee08));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee20,__s,(allocator<char> *)this_00);
  std::
  function<void(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)>
  ::
  function<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__1,void>
            ((function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
              *)in_stack_ffffffffffffedf0,(anon_class_8_1_8991fb9c *)in_stack_ffffffffffffede8);
  arrayPairProcess(in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,pairOp);
  std::
  function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::~function((function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
               *)0x346dbb);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffede0);
  std::allocator<char>::~allocator(local_eb9);
  toml::basic_value<toml::type_config>::~basic_value(in_stack_ffffffffffffede0);
  std::
  function<void(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)>
  ::
  function<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__2,void>
            ((function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
              *)in_stack_ffffffffffffedf0,(anon_class_8_1_8991fb9c *)in_stack_ffffffffffffede8);
  loadTags(in_stack_fffffffffffff090,
           (function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
            *)in_stack_fffffffffffff088.values_);
  std::
  function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::~function((function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
               *)0x346e2d);
  toml::basic_value<toml::type_config>::~basic_value(in_stack_ffffffffffffede0);
  return;
}

Assistant:

void Federate::registerConnectorInterfacesToml(const std::string& tomlString)
{
    using fileops::getOrDefault;
    using fileops::isMember;
    using fileops::replaceIfMember;

    toml::value doc;
    try {
        doc = fileops::loadToml(tomlString);
    }
    catch (const std::invalid_argument& ia) {
        throw(helics::InvalidParameter(ia.what()));
    }
    bool defaultGlobal = false;
    replaceIfMember(doc, "defaultglobal", defaultGlobal);

    if (isMember(doc, "filters")) {
        auto& filts = toml::find(doc, "filters");
        if (!filts.is_array()) {
            throw(helics::InvalidParameter("filters section in toml file must be an array"));
        }
        auto& filtArray = filts.as_array();
        for (const auto& filt : filtArray) {
            const std::string key = getOrDefault(filt, "name", emptyStr);
            const bool cloningflag = getOrDefault(filt, "cloning", false);
            const std::string inputType = getOrDefault(filt, "inputType", emptyStr);
            const std::string outputType = getOrDefault(filt, "outputType", emptyStr);
            const bool useTypes = !((inputType.empty()) && (outputType.empty()));
            const bool global = getOrDefault(filt, "global", defaultGlobal);
            const std::string operation = getOrDefault(filt, "operation", std::string("custom"));

            auto opType = filterTypeFromString(operation);
            if (!checkValidFilterType(useTypes, opType, operation)) {
                continue;
            }
            auto& filter =
                generateFilter(this, global, cloningflag, key, opType, inputType, outputType);

            loadOptions(this, filt, filter);
            addTargetVariations(filt, "source", "endpoints", [&filter](const std::string& target) {
                filter.addSourceTarget(target);
            });
            addTargetVariations(filt,
                                "destination",
                                "endpoints",
                                [&filter](const std::string& target) {
                                    filter.addDestinationTarget(target);
                                });
            if (cloningflag) {
                addTargets(filt, "delivery", [&filter](const std::string& target) {
                    static_cast<CloningFilter&>(filter).addDeliveryEndpoint(target);
                });
            }
            loadPropertiesToml(this, filter, filt, strictConfigChecking);
        }
    }
    if (isMember(doc, "translators")) {
        auto& transs = toml::find(doc, "translators");
        if (!transs.is_array()) {
            throw(helics::InvalidParameter("translators section in toml file must be an array"));
        }
        auto& transArray = transs.as_array();
        for (const auto& trans : transArray) {
            const std::string key = getOrDefault(trans, "name", emptyStr);

            std::string ttype = getOrDefault(trans, "type", std::string("custom"));
            auto opType = translatorTypeFromString(ttype);
            auto etype = fileops::getOrDefault(trans, "endpointtype", emptyStr);
            auto units = fileops::getOrDefault(trans, "unit", emptyStr);
            fileops::replaceIfMember(trans, "units", units);
            const bool global = fileops::getOrDefault(trans, "global", defaultGlobal);

            if (opType == TranslatorTypes::UNRECOGNIZED) {
                if (strictConfigChecking) {
                    const std::string emessage =
                        fmt::format("unrecognized translator type:{}", ttype);
                    logMessage(HELICS_LOG_LEVEL_ERROR, emessage);

                    throw(InvalidParameter(emessage));
                }
                logMessage(HELICS_LOG_LEVEL_WARNING,
                           fmt::format("unrecognized filter operation:{}", ttype));
                continue;
            }
            auto& translator = generateTranslator(this, global, key, opType, etype, units);
            loadOptions(this, trans, translator);

            addTargetVariations(trans,
                                "source",
                                "endpoints",
                                [&translator](const std::string& target) {
                                    translator.addSourceEndpoint(target);
                                });
            addTargetVariations(trans,
                                "destination",
                                "endpoints",
                                [&translator](const std::string& target) {
                                    translator.addDestinationEndpoint(target);
                                });
            addTargetVariations(trans,
                                "source",
                                "publications",
                                [&translator](const std::string& target) {
                                    translator.addPublication(target);
                                });
            addTargetVariations(trans,
                                "destination",
                                "inputs",
                                [&translator](const std::string& target) {
                                    translator.addInputTarget(target);
                                });
            addTargetVariations(trans,
                                "source",
                                "filters",
                                [&translator](const std::string& target) {
                                    translator.addSourceFilter(target);
                                });
            addTargetVariations(trans,
                                "destination",
                                "filters",
                                [&translator](const std::string& target) {
                                    translator.addDestinationFilter(target);
                                });
            loadPropertiesToml(this, translator, trans, strictConfigChecking);
        }
    }
    if (isMember(doc, "globals")) {
        auto& globals = toml::find(doc, "globals");
        if (globals.is_array()) {
            for (auto& val : globals.as_array()) {
                setGlobal(static_cast<std::string_view>(val.as_array()[0].as_string()),
                          static_cast<std::string_view>(val.as_array()[1].as_string()));
            }
        } else {
            for (const auto& val : globals.as_table()) {
                setGlobal(val.first, static_cast<std::string_view>(val.second.as_string()));
            }
        }
    }

    arrayPairProcess(doc, "globals", [this](std::string_view key, std::string_view val) {
        setGlobal(key, val);
    });
    arrayPairProcess(doc, "aliases", [this](std::string_view key, std::string_view val) {
        addAlias(key, val);
    });

    loadTags(doc, [this](std::string_view tagname, std::string_view tagvalue) {
        this->setTag(tagname, tagvalue);
    });
}